

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

bool __thiscall
density::
heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
::empty(heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
        *this)

{
  uintptr_t control_bits;
  ControlBlock *curr;
  heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  *this_local;
  
  control_bits = (uintptr_t)this->m_head;
  while( true ) {
    if ((ControlBlock *)control_bits == this->m_tail) {
      return true;
    }
    if ((*(ulong *)control_bits & 3) == 0) break;
    control_bits = *(ulong *)control_bits & 0xfffffffffffffff8;
  }
  return false;
}

Assistant:

bool empty() const noexcept
        {
            // the queue may contain busy or dead elements, that must be ignored
            for (auto curr = m_head; curr != m_tail;)
            {
                auto const control_bits = curr->m_next & (detail::Queue_Busy | detail::Queue_Dead);
                if (control_bits == 0) // if not busy and not dead
                {
                    return false;
                }
                curr = reinterpret_cast<ControlBlock *>(curr->m_next & ~detail::Queue_AllFlags);
            }
            return true;
        }